

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O1

void __thiscall IndexNode<float>::IndexNode(IndexNode<float> *this,int N)

{
  vector<Addr,_std::allocator<Addr>_> *pvVar1;
  pointer pAVar2;
  uint uVar3;
  ulong uVar4;
  size_type __n;
  undefined4 in_register_00000034;
  allocator_type local_59;
  vector<Addr,_std::allocator<Addr>_> local_58;
  vector<float,_std::allocator<float>_> *local_40;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_00000034,N);
  pvVar1 = &this->p;
  (this->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (this->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->k).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (undefined1  [16])0x0;
  (this->k).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->k).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  __n = (size_type)N;
  local_40 = &this->k;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_58,__n,&local_59);
  std::vector<float,_std::allocator<float>_>::_M_move_assign(&this->k,&local_58);
  if (local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_58,__n,(allocator_type *)&local_59);
  std::vector<char,_std::allocator<char>_>::_M_move_assign(&this->v,&local_58);
  if (local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<Addr,_std::allocator<Addr>_>::vector(&local_58,__n,(allocator_type *)&local_59);
  std::vector<Addr,_std::allocator<Addr>_>::_M_move_assign(pvVar1,&local_58);
  if (local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  this->NodeState = '0';
  uVar3 = (int)local_38 - 1;
  (this->parent).BlockNum = -1;
  (this->parent).FileOff = -1;
  (this->self).BlockNum = -1;
  (this->self).FileOff = -1;
  if (1 < (int)local_38) {
    uVar4 = 0;
    do {
      (this->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar4] = '0';
      pAVar2 = (pvVar1->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.
               super__Vector_impl_data._M_start + uVar4;
      pAVar2->BlockNum = -1;
      pAVar2->FileOff = -1;
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  pAVar2 = (pvVar1->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.super__Vector_impl_data
           ._M_start + (int)uVar3;
  pAVar2->BlockNum = -1;
  pAVar2->FileOff = -1;
  return;
}

Assistant:

IndexNode<K>::IndexNode(int N) {
	int i;
	k = vector<K>(N);
	v = vector<char>(N);
	p = vector<Addr>(N);
	this->NodeState = INTERNAL;
	this->parent = { -1, -1 };
	this->self = { -1, -1 };
	for (i = 0; i < N - 1; i++) {
		this->v[i] = '0';
		this->p[i] = { -1, -1 };
	}
	this->p[N - 1] = { -1, -1 };
}